

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Cone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Gia_Obj_t *pRoot;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  Vec_Int_t *p;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  int v;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  ulong local_430;
  ulong local_428;
  char Buffer [1000];
  
  local_43c = 0;
  Extra_UtilGetoptReset();
  local_430 = 1;
  local_440 = 0;
  bVar3 = false;
  bVar2 = false;
  local_438 = 0;
  local_444 = 0xffffffff;
  local_428 = 0xffffffffffffffff;
LAB_00257e32:
  iVar4 = Extra_UtilGetopt(argc,argv,"ORPLWaevh");
  iVar9 = globalUtilOptind;
  switch(iVar4) {
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-L\" should be followed by an integer.\n";
      break;
    }
    local_43c = atoi(argv[globalUtilOptind]);
    uVar5 = local_43c;
joined_r0x00257ede:
    globalUtilOptind = iVar9 + 1;
    if ((int)uVar5 < 0) {
switchD_00257e4f_caseD_4d:
      iVar9 = -2;
      Abc_Print(-2,"usage: &cone [-ORPLW num] [-aevh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-O num : the index of first PO to extract [default = %d]\n",local_428);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = %d]\n",
                local_430);
      Abc_Print(-2,"\t-P num : (optional) the partition number to extract [default = %d]\n",
                (ulong)local_444);
      Abc_Print(-2,"\t-L num : (optional) extract cones with higher level [default = %d]\n",
                (ulong)local_43c);
      Abc_Print(-2,"\t-W num : (optional) extract cones falling into this window [default = %d]\n",
                (ulong)local_440);
      pcVar7 = "all";
      if (!bVar3) {
        pcVar7 = "structural";
      }
      Abc_Print(-2,"\t-a     : toggle keeping all CIs or structral support only [default = %s]\n",
                pcVar7);
      pcVar10 = "yes";
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle writing all outputs into individual files [default = %s]\n",
                pcVar7);
      if (local_438 == 0) {
        pcVar10 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar10);
      pcVar7 = "\t-h     : print the command usage\n";
LAB_0025815b:
      Abc_Print(iVar9,pcVar7);
      return 1;
    }
    goto LAB_00257e32;
  case 0x4d:
  case 0x4e:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    goto switchD_00257e4f_caseD_4d;
  case 0x4f:
    if (globalUtilOptind < argc) {
      iVar4 = atoi(argv[globalUtilOptind]);
      uVar8 = CONCAT44(extraout_var_00,iVar4);
      local_428 = uVar8;
LAB_00257edc:
      uVar5 = (uint)uVar8;
      goto joined_r0x00257ede;
    }
    pcVar7 = "Command line switch \"-O\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      local_444 = atoi(argv[globalUtilOptind]);
      uVar5 = local_444;
      goto joined_r0x00257ede;
    }
    pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      iVar4 = atoi(argv[globalUtilOptind]);
      uVar8 = CONCAT44(extraout_var,iVar4);
      local_430 = uVar8;
      goto LAB_00257edc;
    }
    pcVar7 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      local_440 = atoi(argv[globalUtilOptind]);
      uVar5 = local_440;
      goto joined_r0x00257ede;
    }
    pcVar7 = "Command line switch \"-W\" should be followed by an integer.\n";
    break;
  default:
    if (iVar4 == 0x61) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else if (iVar4 == 0x65) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      if (iVar4 != 0x76) {
        if (iVar4 == -1) {
          pGVar6 = pAbc->pGia;
          if (pGVar6 == (Gia_Man_t *)0x0) {
            pcVar7 = "Abc_CommandAbc9Cone(): There is no AIG.\n";
          }
          else {
            if (bVar2) {
              iVar9 = pGVar6->vCos->nSize;
              iVar4 = pGVar6->nRegs;
              Abc_Base10Log(iVar9 - iVar4);
              v = 0;
              while ((v < iVar9 - iVar4 && (pRoot = Gia_ManCo(pGVar6,v), pRoot != (Gia_Obj_t *)0x0))
                    ) {
                pGVar6 = Gia_ManDupDfsCone(pAbc->pGia,pRoot);
                pcVar7 = Extra_FileNameGeneric(pAbc->pGia->pSpec);
                sprintf(Buffer,"%s_%0*d.aig",pcVar7);
                Gia_AigerWrite(pGVar6,Buffer,0,0,0);
                Gia_ManStop(pGVar6);
                v = v + 1;
                pGVar6 = pAbc->pGia;
                iVar9 = pGVar6->vCos->nSize;
                iVar4 = pGVar6->nRegs;
              }
              puts("Dumped all outputs into individual AIGER files.");
              return 0;
            }
            if (local_43c == 0 && local_440 == 0) {
              if ((int)local_444 < 0) {
                iVar9 = (int)local_428;
                if ((-1 < iVar9) &&
                   (iVar4 = (int)local_430, iVar4 + iVar9 <= pGVar6->vCos->nSize - pGVar6->nRegs)) {
                  p = Vec_IntAlloc(iVar4);
                  p->nSize = iVar4;
                  for (uVar8 = 0; (local_430 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
                    p->pArray[uVar8] = iVar9 + (int)uVar8;
                  }
                  pGVar6 = Gia_ManDupCones(pAbc->pGia,p->pArray,iVar4,(uint)!bVar3);
                  Vec_IntFree(p);
                  if (pGVar6 == (Gia_Man_t *)0x0) {
                    return 0;
                  }
LAB_002582d7:
                  Abc_FrameUpdateGia(pAbc,pGVar6);
                  return 0;
                }
                pcVar7 = "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n";
              }
              else {
                pVVar1 = pAbc->vPoEquivs;
                if (pVVar1 == (Vec_Ptr_t *)0x0) {
                  pcVar7 = "Abc_CommandAbc9Cone(): Partitions are not defined.\n";
                }
                else {
                  if ((int)local_444 < pVVar1->nSize) {
                    pGVar6 = Gia_ManDupCones(pGVar6,*(int **)((long)pVVar1->pArray[local_444] + 8),
                                             *(int *)((long)pVVar1->pArray[local_444] + 4),
                                             (uint)!bVar3);
                    if (pGVar6 == (Gia_Man_t *)0x0) {
                      return 0;
                    }
                    goto LAB_002582d7;
                  }
                  pcVar7 = "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n";
                }
              }
            }
            else {
              if ((local_43c == 0) || (local_440 == 0)) {
                pGVar6 = Gia_ManExtractWindow(pGVar6,local_43c,local_440,local_438);
                Abc_FrameUpdateGia(pAbc,pGVar6);
                return 0;
              }
              pcVar7 = 
              "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n"
              ;
            }
          }
          iVar9 = -1;
          goto LAB_0025815b;
        }
        goto switchD_00257e4f_caseD_4d;
      }
      local_438 = local_438 ^ 1;
    }
    goto LAB_00257e32;
  }
  Abc_Print(-1,pcVar7);
  goto switchD_00257e4f_caseD_4d;
}

Assistant:

int Abc_CommandAbc9Cone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Vec_Int_t * vPos;
    int c, iOutNum = -1, nOutRange = 1, iPartNum = -1, nLevelMax = 0, nTimeWindow = 0, fUseAllCis = 0, fExtractAll = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORPLWaevh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            iPartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iPartNum < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'a':
            fUseAllCis ^= 1;
            break;
        case 'e':
            fExtractAll ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): There is no AIG.\n" );
        return 1;
    }
    if ( fExtractAll )
    {
        char Buffer[1000];
        Gia_Obj_t * pObj;
        int i, nDigits = Abc_Base10Log(Gia_ManPoNum(pAbc->pGia));
        Gia_ManForEachPo( pAbc->pGia, pObj, i )
        {
            Gia_Man_t * pOne = Gia_ManDupDfsCone( pAbc->pGia, pObj );
            sprintf( Buffer, "%s_%0*d.aig", Extra_FileNameGeneric(pAbc->pGia->pSpec), nDigits, i );
            Gia_AigerWrite( pOne, Buffer, 0, 0, 0 );
            Gia_ManStop( pOne );
        }
        printf( "Dumped all outputs into individual AIGER files.\n" );
        return 0;
    }
    if ( nLevelMax || nTimeWindow )
    {
        if ( nLevelMax && nTimeWindow )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n" );
            return 1;
        }
        else
        {
            pTemp = Gia_ManExtractWindow( pAbc->pGia, nLevelMax, nTimeWindow, fVerbose );
            Abc_FrameUpdateGia( pAbc, pTemp );
            return 0;
        }
    }
    if ( iPartNum >= 0 )
    {
        Vec_Int_t * vClass;
        Vec_Vec_t * vClasses = (Vec_Vec_t *)pAbc->vPoEquivs;
        if ( vClasses == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partitions are not defined.\n" );
            return 1;
        }
        if ( iPartNum >= Vec_VecSize(vClasses) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n" );
            return 1;
        }
        vClass = Vec_VecEntryInt( vClasses, iPartNum );
        pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vClass), Vec_IntSize(vClass), !fUseAllCis );
        if ( pTemp )
            Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    vPos = Vec_IntStartRange( iOutNum, nOutRange );
    pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vPos), nOutRange, !fUseAllCis );
    Vec_IntFree( vPos );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cone [-ORPLW num] [-aevh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to extract [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = %d]\n", nOutRange );
    Abc_Print( -2, "\t-P num : (optional) the partition number to extract [default = %d]\n", iPartNum );
    Abc_Print( -2, "\t-L num : (optional) extract cones with higher level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : (optional) extract cones falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-a     : toggle keeping all CIs or structral support only [default = %s]\n", fUseAllCis? "all": "structural" );
    Abc_Print( -2, "\t-e     : toggle writing all outputs into individual files [default = %s]\n", fExtractAll? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}